

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::updateAccessibility(QTreeViewPrivate *this)

{
  QObject *obj;
  ulong uVar1;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QTreeView *q;
  QAccessibleTableModelChangeEvent event;
  QTreeViewPrivate *this_00;
  QAccessibleTableModelChangeEvent local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  obj = (QObject *)q_func(in_RDI);
  if ((in_RDI->pendingAccessibilityUpdate & 1U) != 0) {
    in_RDI->pendingAccessibilityUpdate = false;
    uVar1 = QAccessible::isActive();
    if ((uVar1 & 1) != 0) {
      memset(local_38,0xaa,0x30);
      QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
                ((QAccessibleTableModelChangeEvent *)this_00,obj,
                 (ModelChangeType)((ulong)in_RDI >> 0x20));
      QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
      QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::updateAccessibility()
{
#if QT_CONFIG(accessibility)
    Q_Q(QTreeView);
    if (pendingAccessibilityUpdate) {
        pendingAccessibilityUpdate = false;
        if (QAccessible::isActive()) {
            QAccessibleTableModelChangeEvent event(q, QAccessibleTableModelChangeEvent::ModelReset);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
}